

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void TrimSpaces(TidyDocImpl *doc,Node *element)

{
  Node *pNVar1;
  Lexer *pLVar2;
  Bool BVar3;
  uint uVar4;
  
  pNVar1 = element->content;
  if ((element->tag == (Dict *)0x0) || (element->tag->id != TidyTag_PRE)) {
    BVar3 = IsPreDescendant(element);
    if (BVar3 == no) {
      BVar3 = prvTidynodeIsText(pNVar1);
      if (BVar3 != no) {
        TrimInitialSpace(doc,element,pNVar1);
      }
      pNVar1 = element->last;
      BVar3 = prvTidynodeIsText(pNVar1);
      if (BVar3 != no) {
        pLVar2 = doc->lexer;
        BVar3 = prvTidynodeIsText(pNVar1);
        if ((((BVar3 != no) && (pNVar1->start < pNVar1->end)) &&
            (uVar4 = pNVar1->end - 1, pLVar2->lexbuf[uVar4] == ' ')) &&
           (pNVar1->end = uVar4, (element->tag->model & 0x410) == 0x10)) {
          pLVar2->insertspace = yes;
        }
      }
    }
  }
  return;
}

Assistant:

static void TrimSpaces( TidyDocImpl* doc, Node *element)
{
    Node* text = element->content;

    if (nodeIsPRE(element) || IsPreDescendant(element))
        return;

    if (TY_(nodeIsText)(text))
        TrimInitialSpace(doc, element, text);

    text = element->last;

    if (TY_(nodeIsText)(text))
        TrimTrailingSpace(doc, element, text);
}